

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

InstanceBuilder * __thiscall
vkb::InstanceBuilder::add_validation_feature_enable
          (InstanceBuilder *this,VkValidationFeatureEnableEXT enable)

{
  VkValidationFeatureEnableEXT local_14;
  InstanceBuilder *pIStack_10;
  VkValidationFeatureEnableEXT enable_local;
  InstanceBuilder *this_local;
  
  local_14 = enable;
  pIStack_10 = this;
  std::vector<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>::
  push_back(&(this->info).enabled_validation_features,&local_14);
  return this;
}

Assistant:

InstanceBuilder& InstanceBuilder::add_validation_feature_enable(VkValidationFeatureEnableEXT enable) {
    info.enabled_validation_features.push_back(enable);
    return *this;
}